

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

int coda_type_get_description(coda_type *type,char **description)

{
  char **description_local;
  coda_type *type_local;
  
  if (type == (coda_type *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0xbcf);
    type_local._4_4_ = -1;
  }
  else if (description == (char **)0x0) {
    coda_set_error(-100,"description argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0xbd4);
    type_local._4_4_ = -1;
  }
  else {
    *description = type->description;
    type_local._4_4_ = 0;
  }
  return type_local._4_4_;
}

Assistant:

LIBCODA_API int coda_type_get_description(const coda_type *type, const char **description)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (description == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "description argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    *description = type->description;
    return 0;
}